

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_timeouts_test.cpp
# Opt level: O0

void __thiscall async_test::binder::operator()(binder *this,completion_type ct)

{
  time_t tVar1;
  ostream *poVar2;
  void *this_00;
  callback<void_(cppcms::http::context::completion_type)> *this_01;
  binder *this_02;
  int in_ESI;
  long in_RDI;
  uint i;
  ostream *out;
  time_t end;
  binder *in_stack_ffffffffffffff78;
  undefined4 in_stack_ffffffffffffffd8;
  uint uVar3;
  
  if (in_ESI == 1) {
    async_bad_count = async_bad_count + 1;
    tVar1 = time((time_t *)0x0);
    poVar2 = std::operator<<((ostream *)&std::cout,"IO Completed in ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,tVar1 - *(long *)(in_RDI + 0x18));
    poVar2 = std::operator<<(poVar2," seconds, timeout=");
    this_00 = (void *)std::ostream::operator<<(poVar2,*(int *)(in_RDI + 0x20));
    std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
    if ((long)(*(int *)(in_RDI + 0x20) * 3) < tVar1 - *(long *)(in_RDI + 0x18)) {
      above_3to = above_3to + 1;
    }
    else if (tVar1 - *(long *)(in_RDI + 0x18) < (long)(*(int *)(in_RDI + 0x20) << 1)) {
      below_2to = below_2to + 1;
    }
  }
  else if (*(int *)(in_RDI + 0x10) < 1) {
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10ea25);
    cppcms::http::context::async_complete_response();
  }
  else {
    *(int *)(in_RDI + 0x10) = *(int *)(in_RDI + 0x10) + -1;
    std::__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                *)0x10e93d);
    cppcms::http::context::response();
    this_01 = (callback<void_(cppcms::http::context::completion_type)> *)
              cppcms::http::response::out();
    for (uVar3 = 0; uVar3 < 1000; uVar3 = uVar3 + 1) {
      poVar2 = (ostream *)std::ostream::operator<<(this_01,uVar3);
      std::operator<<(poVar2,'\n');
    }
    this_02 = (binder *)
              std::
              __shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x10e996);
    binder(this_02,in_stack_ffffffffffffff78);
    booster::callback<void_(cppcms::http::context::completion_type)>::callback<async_test::binder>
              (this_01,(binder *)CONCAT44(uVar3,in_stack_ffffffffffffffd8));
    cppcms::http::context::async_flush_output((callback *)this_02);
    booster::callback<void_(cppcms::http::context::completion_type)>::~callback
              ((callback<void_(cppcms::http::context::completion_type)> *)0x10e9db);
    ~binder((binder *)0x10e9e5);
  }
  return;
}

Assistant:

void operator()(cppcms::http::context::completion_type ct)
		{
			if(ct == cppcms::http::context::operation_aborted) {
				async_bad_count++;
				time_t end = time(0);
				std::cout << "IO Completed in " << (end-start) << " seconds, timeout=" << timeout << std::endl;
				if(end - start > 3*timeout)
					above_3to ++;
				else if(end - start < 2*timeout)
					below_2to ++;
				return;
			}
			if(counter > 0) {
				counter --;
				std::ostream &out = context->response().out();
				for(unsigned i=0;i<1000;i++) {
					out << i << '\n';
				}
				context->async_flush_output(*this);
			}
			else {
				context->async_complete_response();
			}
		}